

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O3

int CfdGetTxCountInBlock(void *handle,void *block_handle,uint32_t *tx_count)

{
  pointer pcVar1;
  uint32_t uVar2;
  CfdException *pCVar3;
  undefined1 local_50 [32];
  
  cfd::Initialize();
  pcVar1 = local_50 + 0x10;
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"BlockOpe","");
  cfd::capi::CheckBuffer(block_handle,(string *)local_50);
  if ((pointer)local_50._0_8_ != pcVar1) {
    operator_delete((void *)local_50._0_8_);
  }
  if (tx_count == (uint32_t *)0x0) {
    local_50._0_8_ = "cfdcapi_block.cpp";
    local_50._8_4_ = 400;
    local_50._16_8_ = "CfdGetTxCountInBlock";
    cfd::core::logger::log<>((CfdSourceLocation *)local_50,kCfdLogLevelWarning,"tx_count is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Failed to parameter. tx_count is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(Block **)((long)block_handle + 0x18) == (Block *)0x0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Invalid handle state. block is null","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_50);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (*(int *)((long)block_handle + 0x10) < 3) {
    uVar2 = cfd::core::Block::GetTransactionCount(*(Block **)((long)block_handle + 0x18));
    *tx_count = uVar2;
    return 0;
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"Elements is not supported.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_50);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxCountInBlock(
    void* handle, void* block_handle, uint32_t* tx_count) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(block_handle, kPrefixBlock);
    CfdCapiBlockData* block_data =
        static_cast<CfdCapiBlockData*>(block_handle);
    if (tx_count == nullptr) {
      warn(CFD_LOG_SOURCE, "tx_count is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx_count is null.");
    }

    if (block_data->block == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. block is null");
    } else if (block_data->net_type <= NetType::kRegtest) {
      *tx_count = block_data->block->GetTransactionCount();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}